

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int erkStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  undefined4 in_EDX;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeERKStepMem *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  SUNOutputFormat in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  local_4 = erkStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    sunfprintf_long((FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                    in_stack_ffffffffffffffd8,(char *)(ulong)in_stack_ffffffffffffffd0,
                    (long)in_stack_ffffffffffffffc8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int erkStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile, SUNOutputFormat fmt)
{
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  sunfprintf_long(outfile, fmt, SUNFALSE, "RHS fn evals", step_mem->nfe);

  return (ARK_SUCCESS);
}